

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_seq_executor.cpp
# Opt level: O2

void __thiscall KeySequentialExecutor::run(KeySequentialExecutor *this)

{
  bind_t<void,_boost::_mfi::mf1<void,_KeySequentialExecutor,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<KeySequentialExecutor_*>,_boost::arg<1>_(*)()>_>
  local_28;
  
  startWorkers(this);
  local_28.f_.f_ = (F)work;
  local_28.f_._8_8_ = 0;
  local_28.l_.super_storage2<boost::_bi::value<KeySequentialExecutor_*>,_boost::arg<1>_(*)()>.
  super_storage1<boost::_bi::value<KeySequentialExecutor_*>_>.a1_.t_ =
       (storage2<boost::_bi::value<KeySequentialExecutor_*>,_boost::arg<1>_(*)()>)
       (storage2<boost::_bi::value<KeySequentialExecutor_*>,_boost::arg<1>_(*)()>)this;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::
  async_wait<boost::_bi::bind_t<void,_boost::_mfi::mf1<void,_KeySequentialExecutor,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<KeySequentialExecutor_*>,_boost::arg<1>_(*)()>_>_>
            (&this->m_wrkTimer,&local_28);
  boost::asio::io_context::run(&this->m_ios);
  stopWorkers(this);
  boost::asio::io_context::stop(&this->m_ios);
  boost::latch::count_down(&this->m_latch);
  return;
}

Assistant:

void KeySequentialExecutor::run()
{
    //std::cout << "\"" << std::this_thread::get_id() << "\": Starting executor ..." << std::endl;
    startWorkers();
    m_wrkTimer.async_wait(boost::bind(&KeySequentialExecutor::work, this, boost::asio::placeholders::error));
    //std::cout << "\"" << std::this_thread::get_id() << "\": Executor is up and running ..." << std::endl;
    m_ios.run();
    stopWorkers();
    m_ios.stop();
    m_latch.count_down();
    //std::cout << "\"" << std::this_thread::get_id() << "\": Executor is stopped" << std::endl;
}